

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_cross.cpp
# Opt level: O0

void __thiscall
spirv_cross::Compiler::analyze_parameter_preservation
          (Compiler *this,SPIRFunction *entry,CFG *cfg,
          unordered_map<unsigned_int,_std::unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>_>_>_>
          *variable_to_blocks,
          unordered_map<unsigned_int,_std::unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>_>_>_>
          *complete_write_blocks)

{
  int iVar1;
  bool bVar2;
  uint32_t uVar3;
  Parameter *pPVar4;
  SPIRType *pSVar5;
  pointer pvVar6;
  undefined1 local_c8 [8];
  unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
  visit_cache;
  uint32_t local_84;
  _Node_iterator_base<std::pair<const_unsigned_int,_std::unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>_>,_false>
  local_80;
  _Node_iterator_base<std::pair<const_unsigned_int,_std::unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>_>,_false>
  local_78;
  uint32_t local_6c;
  _Node_iterator_base<std::pair<const_unsigned_int,_std::unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>_>,_false>
  local_68;
  const_iterator itr;
  bool potential_preserve;
  SPIRType *type;
  Parameter *arg;
  Parameter *__end1;
  Parameter *__begin1;
  SmallVector<spirv_cross::SPIRFunction::Parameter,_8UL> *__range1;
  unordered_map<unsigned_int,_std::unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>_>_>_>
  *complete_write_blocks_local;
  unordered_map<unsigned_int,_std::unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>_>_>_>
  *variable_to_blocks_local;
  CFG *cfg_local;
  SPIRFunction *entry_local;
  Compiler *this_local;
  
  __end1 = VectorView<spirv_cross::SPIRFunction::Parameter>::begin
                     (&(entry->arguments).super_VectorView<spirv_cross::SPIRFunction::Parameter>);
  pPVar4 = VectorView<spirv_cross::SPIRFunction::Parameter>::end
                     (&(entry->arguments).super_VectorView<spirv_cross::SPIRFunction::Parameter>);
  for (; __end1 != pPVar4; __end1 = __end1 + 1) {
    uVar3 = TypedID::operator_cast_to_unsigned_int((TypedID *)__end1);
    pSVar5 = get<spirv_cross::SPIRType>(this,uVar3);
    if ((pSVar5->pointer & 1U) != 0) {
      iVar1 = *(int *)&(pSVar5->super_IVariant).field_0xc;
      if ((iVar1 == 0xb) || (iVar1 - 0x10U < 3)) {
        itr.
        super__Node_iterator_base<std::pair<const_unsigned_int,_std::unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>_>,_false>
        ._M_cur._7_1_ = '\0';
      }
      else {
        itr.
        super__Node_iterator_base<std::pair<const_unsigned_int,_std::unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>_>,_false>
        ._M_cur._7_1_ = '\x01';
      }
      if (itr.
          super__Node_iterator_base<std::pair<const_unsigned_int,_std::unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>_>,_false>
          ._M_cur._7_1_ != '\0') {
        local_6c = TypedID::operator_cast_to_unsigned_int((TypedID *)&__end1->id);
        local_68._M_cur =
             (__node_type *)
             ::std::
             unordered_map<unsigned_int,_std::unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>_>_>_>
             ::find(variable_to_blocks,&local_6c);
        local_78._M_cur =
             (__node_type *)
             ::std::
             end<std::unordered_map<unsigned_int,std::unordered_set<unsigned_int,std::hash<unsigned_int>,std::equal_to<unsigned_int>,std::allocator<unsigned_int>>,std::hash<unsigned_int>,std::equal_to<unsigned_int>,std::allocator<std::pair<unsigned_int_const,std::unordered_set<unsigned_int,std::hash<unsigned_int>,std::equal_to<unsigned_int>,std::allocator<unsigned_int>>>>>>
                       (variable_to_blocks);
        bVar2 = ::std::__detail::operator==(&local_68,&local_78);
        if (!bVar2) {
          local_84 = TypedID::operator_cast_to_unsigned_int((TypedID *)&__end1->id);
          local_80._M_cur =
               (__node_type *)
               ::std::
               unordered_map<unsigned_int,_std::unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>_>_>_>
               ::find(complete_write_blocks,&local_84);
          local_68._M_cur = local_80._M_cur;
          visit_cache._M_h._M_single_bucket =
               (__node_base_ptr)
               ::std::
               end<std::unordered_map<unsigned_int,std::unordered_set<unsigned_int,std::hash<unsigned_int>,std::equal_to<unsigned_int>,std::allocator<unsigned_int>>,std::hash<unsigned_int>,std::equal_to<unsigned_int>,std::allocator<std::pair<unsigned_int_const,std::unordered_set<unsigned_int,std::hash<unsigned_int>,std::equal_to<unsigned_int>,std::allocator<unsigned_int>>>>>>
                         (complete_write_blocks);
          bVar2 = ::std::__detail::operator==
                            (&local_68,
                             (_Node_iterator_base<std::pair<const_unsigned_int,_std::unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>_>,_false>
                              *)&visit_cache._M_h._M_single_bucket);
          if (bVar2) {
            __end1->read_count = __end1->read_count + 1;
          }
          else {
            ::std::
            unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
            ::unordered_set((unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
                             *)local_c8);
            uVar3 = TypedID::operator_cast_to_unsigned_int((TypedID *)&entry->entry_block);
            pvVar6 = ::std::__detail::
                     _Node_const_iterator<std::pair<const_unsigned_int,_std::unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>_>,_false,_false>
                     ::operator->((_Node_const_iterator<std::pair<const_unsigned_int,_std::unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>_>,_false,_false>
                                   *)&local_68);
            bVar2 = exists_unaccessed_path_to_return
                              (cfg,uVar3,&pvVar6->second,
                               (unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
                                *)local_c8);
            if (bVar2) {
              __end1->read_count = __end1->read_count + 1;
            }
            ::std::
            unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
            ::~unordered_set((unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
                              *)local_c8);
          }
        }
      }
    }
  }
  return;
}

Assistant:

void Compiler::analyze_parameter_preservation(
    SPIRFunction &entry, const CFG &cfg, const unordered_map<uint32_t, unordered_set<uint32_t>> &variable_to_blocks,
    const unordered_map<uint32_t, unordered_set<uint32_t>> &complete_write_blocks)
{
	for (auto &arg : entry.arguments)
	{
		// Non-pointers are always inputs.
		auto &type = get<SPIRType>(arg.type);
		if (!type.pointer)
			continue;

		// Opaque argument types are always in
		bool potential_preserve;
		switch (type.basetype)
		{
		case SPIRType::Sampler:
		case SPIRType::Image:
		case SPIRType::SampledImage:
		case SPIRType::AtomicCounter:
			potential_preserve = false;
			break;

		default:
			potential_preserve = true;
			break;
		}

		if (!potential_preserve)
			continue;

		auto itr = variable_to_blocks.find(arg.id);
		if (itr == end(variable_to_blocks))
		{
			// Variable is never accessed.
			continue;
		}

		// We have accessed a variable, but there was no complete writes to that variable.
		// We deduce that we must preserve the argument.
		itr = complete_write_blocks.find(arg.id);
		if (itr == end(complete_write_blocks))
		{
			arg.read_count++;
			continue;
		}

		// If there is a path through the CFG where no block completely writes to the variable, the variable will be in an undefined state
		// when the function returns. We therefore need to implicitly preserve the variable in case there are writers in the function.
		// Major case here is if a function is
		// void foo(int &var) { if (cond) var = 10; }
		// Using read/write counts, we will think it's just an out variable, but it really needs to be inout,
		// because if we don't write anything whatever we put into the function must return back to the caller.
		unordered_set<uint32_t> visit_cache;
		if (exists_unaccessed_path_to_return(cfg, entry.entry_block, itr->second, visit_cache))
			arg.read_count++;
	}
}